

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress.c
# Opt level: O2

size_t ZSTD_nextSrcSizeToDecompressWithInputSize(ZSTD_DCtx *dctx,size_t inputSize)

{
  ulong uVar1;
  
  if ((dctx->stage - ZSTDds_decompressBlock < 2) && (dctx->bType == bt_raw)) {
    uVar1 = inputSize + (inputSize == 0);
    if (dctx->expected <= uVar1) {
      uVar1 = dctx->expected;
    }
    return uVar1;
  }
  return dctx->expected;
}

Assistant:

static size_t ZSTD_nextSrcSizeToDecompressWithInputSize(ZSTD_DCtx* dctx, size_t inputSize) {
    if (!(dctx->stage == ZSTDds_decompressBlock || dctx->stage == ZSTDds_decompressLastBlock))
        return dctx->expected;
    if (dctx->bType != bt_raw)
        return dctx->expected;
    return MIN(MAX(inputSize, 1), dctx->expected);
}